

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncSatToUI16(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  float fVar2;
  uint uVar3;
  Literal local_50;
  Literal local_38;
  float local_1c;
  
  if ((this->type).id == 4) {
    Literal(&local_50,this);
    castToI32(&local_38,&local_50);
    fVar2 = (float)geti32(&local_38);
    local_1c = fVar2;
    if (NAN(fVar2)) {
      uVar3 = 0;
    }
    else {
      bVar1 = isInRangeI16TruncU((int32_t)fVar2);
      if (bVar1) {
        fVar2 = truncf(local_1c);
        uVar3 = (int)fVar2 & 0xffff;
      }
      else {
        uVar3 = 0xffff;
        if ((int)fVar2 < 0) {
          uVar3 = 0;
        }
      }
    }
    (__return_storage_ptr__->field_0).i32 = uVar3;
    (__return_storage_ptr__->type).id = 2;
    ~Literal(&local_38);
    ~Literal(&local_50);
    return __return_storage_ptr__;
  }
  handle_unreachable("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                     ,0x39e);
}

Assistant:

Literal Literal::truncSatToUI16() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint16_t, isInRangeI16TruncU>(
      Literal(*this).castToI32().geti32());
  }
  WASM_UNREACHABLE("invalid type");
}